

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_float<char,fmt::v10::appender,long_double>
                   (appender out,longdouble value,format_specs<char> specs,locale_ref loc)

{
  undefined8 this;
  bool bVar1;
  char cVar2;
  int iVar3;
  float_specs fVar4;
  appender *paVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *this_00;
  char *s;
  size_t sVar6;
  appender out_00;
  buffer<char> *this_01;
  format_specs<char> *in_R8;
  float_specs *in_R9;
  longdouble in_ST0;
  string_view bytes;
  format_specs<char> specs_00;
  int local_374;
  undefined1 local_320 [8];
  big_decimal_fp f;
  int local_300;
  int exp;
  int precision;
  char *local_2f0;
  detail *local_2e8;
  float_specs local_2e0;
  char local_2d5 [20];
  undefined1 local_2c1;
  undefined1 local_2c0 [8];
  memory_buffer buffer;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_90;
  char local_81;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_80;
  appender it;
  float_specs local_60;
  float_specs fspecs;
  longdouble value_local;
  locale_ref loc_local;
  format_specs<char> specs_local;
  appender out_local;
  
  specs_local._0_8_ = specs._8_8_;
  loc_local.locale_ = specs._0_8_;
  _fspecs = value;
  specs_local._8_8_ = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  fVar4 = parse_float_type_spec<char>((format_specs<char> *)&loc_local);
  local_60._6_2_ = fVar4._6_2_;
  local_60._0_5_ = fVar4._0_5_;
  local_60 = (float_specs)
             (CONCAT26(local_60._6_2_,CONCAT15(specs_local.width._1_1_ >> 4,local_60._0_5_)) &
             0xffff07ffffffffff);
  bVar1 = std::signbit((double)_fspecs);
  if (bVar1) {
    local_60._5_1_ = 1;
    _fspecs = -_fspecs;
  }
  else if (((uint)local_60._4_4_ >> 8 & 0xff) == 1) {
    local_60 = (float_specs)((ulong)local_60 & 0xffff00ffffffffff);
  }
  bVar1 = isfinite<long_double,_0>(_fspecs);
  this = specs_local._8_8_;
  if (bVar1) {
    if (((specs_local.width._1_1_ & 0xf) == 4) && (local_60._5_1_ != '\0')) {
      paVar5 = reserve<fmt::v10::appender>((appender *)&specs_local.type,1);
      local_80.container =
           (paVar5->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_81 = sign<char,fmt::v10::sign::type>(local_60._5_1_);
      local_90.container = (buffer<char> *)appender::operator++((appender *)&local_80,0);
      this_00 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_90);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(this_00,&local_81);
      buffer._528_8_ = local_80.container;
      specs_local._8_8_ =
           base_iterator<fmt::v10::appender>
                     ((appender)specs_local._8_8_,(appender)local_80.container);
      local_60 = (float_specs)((ulong)local_60 & 0xffff00ffffffffff);
      if ((int)loc_local.locale_ != 0) {
        loc_local.locale_._0_4_ = (int)loc_local.locale_ + -1;
      }
    }
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2c0,
               (allocator<char> *)&local_2c1);
    this_01 = (buffer<char> *)&local_2c1;
    std::allocator<char>::~allocator((allocator<char> *)this_01);
    cVar2 = local_60._4_1_;
    if (cVar2 == '\x03') {
      if (local_60._5_1_ != none) {
        local_2d5[0] = sign<char,fmt::v10::sign::type>(local_60._5_1_);
        this_01 = (buffer<char> *)local_2c0;
        buffer<char>::push_back(this_01,local_2d5);
      }
      convert_float<long_double>((convert_float_result<long_double> *)this_01,_fspecs);
      local_2e0 = local_60;
      format_hexfloat<long_double,_0>
                (in_ST0,loc_local.locale_._4_4_,local_60,(buffer<char> *)local_2c0);
      local_2e8 = (detail *)specs_local._8_8_;
      s = buffer<char>::data((buffer<char> *)local_2c0);
      sVar6 = buffer<char>::size((buffer<char> *)local_2c0);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)&precision,s,sVar6);
      bytes.size_ = (size_t)&loc_local;
      bytes.data_ = local_2f0;
      out_local = write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>
                            (local_2e8,(appender)_precision,bytes,in_R8);
    }
    else {
      if (((long)loc_local.locale_ < 0) && ((char)specs_local.width != '\0')) {
        local_374 = 6;
      }
      else {
        local_374 = loc_local.locale_._4_4_;
      }
      local_300 = local_374;
      if (cVar2 == '\x01') {
        iVar3 = max_value<int>();
        if (local_374 == iVar3) {
          throw_format_error("number is too big");
        }
        local_300 = local_374 + 1;
      }
      else if ((cVar2 != '\x02') && (local_374 == 0)) {
        local_300 = 1;
      }
      convert_float<long_double>((convert_float_result<long_double> *)this_01,_fspecs);
      f._8_8_ = local_60;
      iVar3 = format_float<long_double>(in_ST0,local_300,local_60,(buffer<char> *)local_2c0);
      local_60.precision = local_300;
      local_320 = (undefined1  [8])buffer<char>::data((buffer<char> *)local_2c0);
      sVar6 = buffer<char>::size((buffer<char> *)local_2c0);
      f.significand._0_4_ = (undefined4)sVar6;
      f.significand._4_4_ = iVar3;
      out_local = write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char>
                            ((appender)specs_local._8_8_,(big_decimal_fp *)local_320,
                             (format_specs<char> *)&loc_local,local_60,loc);
    }
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2c0);
  }
  else {
    bVar1 = isnan<long_double>(_fspecs);
    it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)loc_local.locale_;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ = bVar1;
    specs_00._8_8_ = &local_60;
    specs_00.width = specs_local.width;
    specs_00.precision = specs_local.precision;
    out_local = write_nonfinite<char,fmt::v10::appender>
                          ((detail *)this,out_00,SUB81(loc_local.locale_,0),specs_00,in_R9);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}